

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O0

void __thiscall
dlib::image_window::on_keydown
          (image_window *this,unsigned_long key,bool is_printable,unsigned_long state)

{
  byte bVar1;
  undefined8 in_RCX;
  byte in_DL;
  __sighandler_t __handler;
  int __sig;
  undefined8 in_RSI;
  unsigned_long in_RDI;
  drawable_window *unaff_retaddr;
  undefined7 in_stack_ffffffffffffffe8;
  
  bVar1 = in_DL & 1;
  __sig = (int)in_RSI;
  drawable_window::on_keydown
            (unaff_retaddr,in_RDI,SUB81((ulong)in_RSI >> 0x38,0),
             CONCAT17(in_DL,in_stack_ffffffffffffffe8) & 0x1ffffffffffffff);
  *(undefined1 *)(in_RDI + 0x1e40) = 1;
  *(undefined8 *)(in_RDI + 0x1e48) = in_RSI;
  *(byte *)(in_RDI + 0x1e50) = bVar1 & 1;
  *(undefined8 *)(in_RDI + 0x1e58) = in_RCX;
  rsignaler::signal((rsignaler *)(in_RDI + 0x1dd0),__sig,__handler);
  return;
}

Assistant:

void image_window::
    on_keydown (
        unsigned long key,
        bool is_printable,
        unsigned long state
    )
    {
        dlib::drawable_window::on_keydown(key,is_printable,state);

        have_last_keypress = true;
        next_key = key;
        next_is_printable = is_printable;
        next_state = state;
        clicked_signaler.signal();
    }